

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

matrix4d *
tinyusdz::trs_angle_xyz
          (matrix4d *__return_storage_ptr__,double3 *translation,double3 *rotation_angles_xyz,
          double3 *scale)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  matrix4d *n;
  anon_union_128_2_293c120a_for_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  *paVar3;
  matrix4d *pmVar4;
  byte bVar5;
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  XformEvaluator eval;
  matrix4d ret_1;
  matrix4d sMat;
  matrix4d tMat;
  matrix4d rMat;
  undefined1 local_358 [128];
  char local_2d8;
  XformEvaluator local_2d0;
  value local_230 [128];
  double local_1b0 [6];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  double local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  matrix4d local_130;
  matrix4d local_b0;
  
  bVar5 = 0;
  __return_storage_ptr__->m[0][0] = 1.0;
  __return_storage_ptr__->m[0][1] = 0.0;
  __return_storage_ptr__->m[0][2] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[1][1] = 1.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  paVar1 = &local_2d0.err.field_2;
  local_2d0.err._M_string_length = 0;
  local_2d0.err.field_2._M_local_buf[0] = '\0';
  local_2d0.m.m[1][2] = 0.0;
  local_2d0.m.m[1][3] = 0.0;
  local_2d0.m.m[2][0] = 0.0;
  local_2d0.m.m[2][1] = 0.0;
  local_2d0.m.m[1][0] = 0.0;
  local_2d0.m.m[1][1] = 0.0;
  local_2d0.m.m[0][0] = 0.0;
  local_2d0.m.m[0][1] = 0.0;
  local_2d0.m.m[0][2] = 0.0;
  local_2d0.m.m[0][3] = 0.0;
  local_2d0.m.m[3][2] = 0.0;
  local_2d0.m.m[3][3] = 0.0;
  local_2d0.m.m[2][2] = 0.0;
  local_2d0.m.m[2][3] = 0.0;
  local_2d0.m.m[3][0] = 0.0;
  local_2d0.m.m[3][1] = 0.0;
  lVar2 = 0x20;
  do {
    *(undefined8 *)((long)(local_2d0.m.m + -1) + lVar2) = 0x3ff0000000000000;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0xc0);
  local_2d0.err._M_dataplus._M_p = (pointer)paVar1;
  anon_unknown_4::XformEvaluator::RotateX(&local_2d0,rotation_angles_xyz->_M_elems[0]);
  anon_unknown_4::XformEvaluator::RotateY(&local_2d0,rotation_angles_xyz->_M_elems[1]);
  anon_unknown_4::XformEvaluator::RotateZ(&local_2d0,rotation_angles_xyz->_M_elems[2]);
  (anonymous_namespace)::XformEvaluator::result_abi_cxx11_
            ((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&((anon_union_128_2_293c120a_for_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                   *)local_358)->m_value,&local_2d0);
  if (local_2d8 == '\x01') {
    paVar3 = (anon_union_128_2_293c120a_for_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
              *)local_358;
    pmVar4 = &local_b0;
    for (n = (matrix4d *)0x10; n != (matrix4d *)0x0; n = (matrix4d *)((long)n[-1].m[3] + 0x1f)) {
      pmVar4->m[0][0] = (paVar3->m_value).m[0][0];
      paVar3 = (anon_union_128_2_293c120a_for_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                *)((long)paVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      pmVar4 = (matrix4d *)((long)pmVar4 + ((ulong)bVar5 * -2 + 1) * 8);
    }
    local_130.m[0][0] = 1.0;
    local_130.m[0][1] = 0.0;
    local_130.m[0][2] = 0.0;
    local_130.m[0][3] = 0.0;
    local_130.m[1][0] = 0.0;
    local_130.m[1][1] = 1.0;
    local_130.m[1][2] = 0.0;
    local_130.m[1][3] = 0.0;
    local_130.m[2][0] = 0.0;
    local_130.m[2][1] = 0.0;
    local_130.m[2][2] = 1.0;
    local_130.m[2][3] = 0.0;
    local_130.m[3][3] = 1.0;
    local_130.m[3][0] = translation->_M_elems[0];
    local_130.m[3][1] = translation->_M_elems[1];
    local_130.m[3][2] = translation->_M_elems[2];
    local_1b0[1] = 0.0;
    local_1b0[2] = 0.0;
    local_1b0[3] = 0.0;
    local_1b0[4] = 0.0;
    local_180 = 0;
    uStack_178 = 0;
    local_170 = 0;
    uStack_168 = 0;
    local_158 = 0;
    uStack_150 = 0;
    local_148 = 0;
    uStack_140 = 0;
    local_138 = 0x3ff0000000000000;
    local_1b0[0] = scale->_M_elems[0];
    local_1b0[5] = scale->_M_elems[1];
    local_160 = scale->_M_elems[2];
    value::Mult<tinyusdz::value::matrix4d,double,4ul>
              ((matrix4d *)local_230,(value *)local_1b0,&local_b0,(matrix4d *)0x0);
    value::Mult<tinyusdz::value::matrix4d,double,4ul>(__return_storage_ptr__,local_230,&local_130,n)
    ;
  }
  if ((local_2d8 == '\0') &&
     ((double *)local_358._0_8_ !=
      (double *)
      ((long)(((anon_union_128_2_293c120a_for_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                *)local_358)->m_value).m + 0x10U))) {
    operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.err._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0.err._M_dataplus._M_p,
                    CONCAT71(local_2d0.err.field_2._M_allocated_capacity._1_7_,
                             local_2d0.err.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d trs_angle_xyz(const value::double3 &translation,
                              const value::double3 &rotation_angles_xyz,
                              const value::double3 &scale) {
  value::matrix4d m{value::matrix4d::identity()};

  XformEvaluator eval;
#if defined(PXR_COMPATIBLE_ROTATE_MATRIX_GENERATION)
  eval.Rotation({1.0, 0.0, 0.0}, rotation_angles_xyz[0]);
  eval.Rotation({0.0, 1.0, 0.0}, rotation_angles_xyz[1]);
  eval.Rotation({0.0, 0.0, 1.0}, rotation_angles_xyz[2]);
#else
  eval.RotateX(rotation_angles_xyz[0]);
  eval.RotateY(rotation_angles_xyz[1]);
  eval.RotateZ(rotation_angles_xyz[2]);
#endif

  auto ret = eval.result();
  if (!ret) {
    // This should not happend though.
    return m;
  }
  value::matrix4d rMat = ret.value();

  value::matrix4d tMat{value::matrix4d::identity()};
  tMat.m[3][0] = translation[0];
  tMat.m[3][1] = translation[1];
  tMat.m[3][2] = translation[2];

  value::matrix4d sMat{value::matrix4d::identity()};
  sMat.m[0][0] = scale[0];
  sMat.m[1][1] = scale[1];
  sMat.m[2][2] = scale[2];

  m = sMat * rMat * tMat;

  return m;
}